

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

size_t mg_printf_data(mg_connection *c,char *fmt,...)

{
  char *__ptr;
  char in_AL;
  int len;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buf;
  va_list ap;
  char mem [8192];
  char *local_2100;
  __va_list_tag local_20f8;
  undefined1 local_20d8 [16];
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  char local_2028 [8192];
  
  if (in_AL != '\0') {
    local_20a8 = in_XMM0_Qa;
    local_2098 = in_XMM1_Qa;
    local_2088 = in_XMM2_Qa;
    local_2078 = in_XMM3_Qa;
    local_2068 = in_XMM4_Qa;
    local_2058 = in_XMM5_Qa;
    local_2048 = in_XMM6_Qa;
    local_2038 = in_XMM7_Qa;
  }
  local_2100 = local_2028;
  local_20c8 = in_RDX;
  local_20c0 = in_RCX;
  local_20b8 = in_R8;
  local_20b0 = in_R9;
  terminate_headers(c);
  local_20f8.overflow_arg_area = &buf;
  local_20f8.gp_offset = 0x10;
  local_20f8.fp_offset = 0x30;
  local_20f8.reg_save_area = local_20d8;
  len = ns_avprintf(&local_2100,0x2000,fmt,&local_20f8);
  __ptr = local_2100;
  if (-1 < len) {
    write_chunk((connection *)&c[-1].callback_param,local_2100,len);
  }
  if (__ptr != (char *)0x0 && __ptr != local_2028) {
    free(__ptr);
  }
  return *(size_t *)((long)c[-1].callback_param + 0x58);
}

Assistant:

size_t mg_printf_data(struct mg_connection *c, const char *fmt, ...) {
  struct connection *conn = MG_CONN_2_CONN(c);
  va_list ap;
  int len;
  char mem[IOBUF_SIZE], *buf = mem;

  terminate_headers(c);

  va_start(ap, fmt);
  len = ns_avprintf(&buf, sizeof(mem), fmt, ap);
  va_end(ap);

  if (len >= 0) {
    write_chunk((struct connection *) conn, buf, len);
  }
  if (buf != mem && buf != NULL) {
    free(buf);
  }
  return conn->ns_conn->send_iobuf.len;
}